

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

void __thiscall ArgumentParser::Base::Bind(Base *this,size_t pos,PositionAction *action)

{
  pair<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>,_bool>
  pVar1;
  function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_58;
  pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
  *local_38;
  byte local_30;
  byte local_21;
  PositionAction *pPStack_20;
  bool inserted;
  PositionAction *action_local;
  size_t pos_local;
  Base *this_local;
  
  pPStack_20 = action;
  action_local = (PositionAction *)pos;
  pos_local = (size_t)this;
  std::
  function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function(&local_58,action);
  pVar1 = PositionActionMap::Emplace(&(this->Bindings).Positions,pos,&local_58);
  local_38 = (pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>
              *)pVar1.first._M_current;
  local_30 = pVar1.second;
  std::
  function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function(&local_58);
  local_21 = pVar1.second & 1;
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return;
  }
  __assert_fail("inserted",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h"
                ,0x9a,"void ArgumentParser::Base::Bind(std::size_t, PositionAction)");
}

Assistant:

void Bind(std::size_t pos, PositionAction action)
  {
    bool const inserted =
      this->Bindings.Positions.Emplace(pos, std::move(action)).second;
    assert(inserted);
    static_cast<void>(inserted);
  }